

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserv_config.cpp
# Opt level: O2

void eoserv_config_validate_config(Config *config)

{
  eoserv_config_default<char_const*>(config,"LogOut","-");
  eoserv_config_default<char_const*>(config,"LogErr","error.log");
  eoserv_config_default<bool>(config,"StyleConsole",true);
  eoserv_config_default<bool>(config,"LogCommands",true);
  eoserv_config_default<char_const*>(config,"Host","0.0.0.0");
  eoserv_config_default<int>(config,"Port",0x1f8e);
  eoserv_config_default<int>(config,"MaxConnections",300);
  eoserv_config_default<int>(config,"ListenBacklog",0x32);
  eoserv_config_default<int>(config,"MaxPlayers",200);
  eoserv_config_default<int>(config,"MaxConnectionsPerIP",3);
  eoserv_config_default<double>(config,"IPReconnectLimit",10.0);
  eoserv_config_default<int>(config,"MaxConnectionsPerPC",1);
  eoserv_config_default<double>(config,"HangupDelay",10.0);
  eoserv_config_default<bool>(config,"QuietConnectionErrors",false);
  eoserv_config_default<int>(config,"MaxLoginAttempts",3);
  eoserv_config_default<bool>(config,"CheckVersion",true);
  eoserv_config_default<int>(config,"MinVersion",0);
  eoserv_config_default<int>(config,"MaxVersion",0);
  eoserv_config_default<bool>(config,"OldVersionCompat",false);
  eoserv_config_default<char_const*>(config,"TimedSave","5m");
  eoserv_config_default<bool>(config,"IgnoreHDID",false);
  eoserv_config_default<char_const*>(config,"ServerLanguage","./lang/en.ini");
  eoserv_config_default<int>(config,"PacketQueueMax",0x28);
  eoserv_config_default<double>(config,"PingRate",60.0);
  eoserv_config_default<bool>(config,"EnforceSequence",true);
  eoserv_config_default<bool>(config,"EnforceTimestamps",true);
  eoserv_config_default<bool>(config,"EnforceSessions",true);
  eoserv_config_default<char_const*>(config,"PasswordSalt","ChangeMe");
  eoserv_config_default<char_const*>(config,"SeoseCompat","ChangeMe");
  eoserv_config_default<char_const*>(config,"SeoseCompatKey","D4q9_f30da%#q02#)8");
  eoserv_config_default<char_const*>(config,"DBType","mysql");
  eoserv_config_default<char_const*>(config,"DBHost","localhost");
  eoserv_config_default<char_const*>(config,"DBUser","eoserv");
  eoserv_config_default<char_const*>(config,"DBPass","eoserv");
  eoserv_config_default<char_const*>(config,"DBName","eoserv");
  eoserv_config_default<int>(config,"DBPort",0);
  eoserv_config_default<char_const*>(config,"EIF","./data/pub/dat001.eif");
  eoserv_config_default<char_const*>(config,"ENF","./data/pub/dtn001.enf");
  eoserv_config_default<char_const*>(config,"ESF","./data/pub/dsl001.esf");
  eoserv_config_default<char_const*>(config,"ECF","./data/pub/dat001.ecf");
  eoserv_config_default<bool>(config,"AutoSplitPubFiles",true);
  eoserv_config_default<char_const*>(config,"NewsFile","./data/news.txt");
  eoserv_config_default<char_const*>(config,"DropsFile","./data/drops.ini");
  eoserv_config_default<char_const*>(config,"ShopsFile","./data/shops.ini");
  eoserv_config_default<char_const*>(config,"ArenasFile","./data/arenas.ini");
  eoserv_config_default<char_const*>(config,"FormulasFile","./data/formulas.ini");
  eoserv_config_default<char_const*>(config,"HomeFile","./data/home.ini");
  eoserv_config_default<char_const*>(config,"SkillsFile","./data/skills.ini");
  eoserv_config_default<char_const*>(config,"MapDir","./data/maps/");
  eoserv_config_default<int>(config,"Maps",0x116);
  eoserv_config_default<char_const*>(config,"QuestDir","./data/quests/");
  eoserv_config_default<int>(config,"Quests",0);
  eoserv_config_default<char_const*>(config,"BotCharacters","");
  eoserv_config_default<int>(config,"GuildPrice",50000);
  eoserv_config_default<int>(config,"RecruitCost",1000);
  eoserv_config_default<int>(config,"GuildMaxMembers",5000);
  eoserv_config_default<int>(config,"GuildCreateMembers",9);
  eoserv_config_default<int>(config,"GuildBankMax",2000000000);
  eoserv_config_default<char_const*>(config,"GuildDefaultRanks","Leader,Recruiter,,,,,,,New Member")
  ;
  eoserv_config_default<bool>(config,"GuildShowRecruiters",true);
  eoserv_config_default<bool>(config,"GuildCustomRanks",false);
  eoserv_config_default<int>(config,"GuildEditRank",1);
  eoserv_config_default<int>(config,"GuildKickRank",1);
  eoserv_config_default<int>(config,"GuildPromoteRank",1);
  eoserv_config_default<int>(config,"GuildPromoteSameRank",1);
  eoserv_config_default<int>(config,"GuildDemoteRank",1);
  eoserv_config_default<int>(config,"GuildRecruitRank",2);
  eoserv_config_default<int>(config,"GuildDisbandRank",0);
  eoserv_config_default<bool>(config,"GuildMultipleFounders",true);
  eoserv_config_default<bool>(config,"GuildAnnounce",true);
  eoserv_config_default<char_const*>(config,"GuildDateFormat","%Y/%m/%d");
  eoserv_config_default<int>(config,"GuildMinDeposit",1000);
  eoserv_config_default<int>(config,"GuildMaxNameLength",0x18);
  eoserv_config_default<int>(config,"GuildMaxDescLength",0xf0);
  eoserv_config_default<int>(config,"GuildMaxRankLength",0x10);
  eoserv_config_default<int>(config,"GuildMaxWidth",0xb4);
  eoserv_config_default<bool>(config,"GlobalPK",false);
  eoserv_config_default<char_const*>(config,"PKExcept","");
  eoserv_config_default<int>(config,"NPCChaseMode",0);
  eoserv_config_default<int>(config,"NPCChaseDistance",0x12);
  eoserv_config_default<int>(config,"NPCBoredTimer",0x1e);
  eoserv_config_default<int>(config,"NPCAdjustMaxDam",3);
  eoserv_config_default<int>(config,"BoardMaxPosts",0x14);
  eoserv_config_default<int>(config,"BoardMaxUserPosts",6);
  eoserv_config_default<int>(config,"BoardMaxRecentPosts",2);
  eoserv_config_default<int>(config,"BoardRecentPostTime",0x708);
  eoserv_config_default<int>(config,"BoardMaxSubjectLength",0x20);
  eoserv_config_default<int>(config,"BoardMaxPostLength",0x800);
  eoserv_config_default<bool>(config,"BoardDatePosts",true);
  eoserv_config_default<int>(config,"AdminBoard",8);
  eoserv_config_default<int>(config,"AdminBoardLimit",100);
  eoserv_config_default<bool>(config,"FirstCharacterAdmin",true);
  eoserv_config_default<bool>(config,"ShowLevel",false);
  eoserv_config_default<bool>(config,"WarpBubbles",true);
  eoserv_config_default<bool>(config,"HideGlobal",false);
  eoserv_config_default<int>(config,"GlobalBuffer",0);
  eoserv_config_default<char_const*>(config,"AdminPrefix","$");
  eoserv_config_default<int>(config,"StatPerLevel",3);
  eoserv_config_default<int>(config,"SkillPerLevel",4);
  eoserv_config_default<int>(config,"EnforceWeight",2);
  eoserv_config_default<int>(config,"MaxWeight",0xfa);
  eoserv_config_default<int>(config,"MaxLevel",0xfa);
  eoserv_config_default<int>(config,"MaxExp",2000000000);
  eoserv_config_default<int>(config,"MaxStat",10000);
  eoserv_config_default<int>(config,"MaxHPTP",64000);
  eoserv_config_default<int>(config,"MaxSkillLevel",100);
  eoserv_config_default<int>(config,"MaxSkills",0x30);
  eoserv_config_default<int>(config,"MaxCharacters",3);
  eoserv_config_default<int>(config,"MaxShopBuy",4);
  eoserv_config_default<int>(config,"GhostTimer",4);
  eoserv_config_default<double>(config,"SpellCastCooldown",0.6);
  eoserv_config_default<int>(config,"DropTimer",0x78);
  eoserv_config_default<int>(config,"DropAmount",0xf);
  eoserv_config_default<int>(config,"ProtectPlayerDrop",5);
  eoserv_config_default<int>(config,"ProtectNPCDrop",0x1e);
  eoserv_config_default<int>(config,"ProtectPKDrop",0x3c);
  eoserv_config_default<int>(config,"ProtectDeathDrop",300);
  eoserv_config_default<int>(config,"SeeDistance",0xb);
  eoserv_config_default<int>(config,"DropDistance",2);
  eoserv_config_default<int>(config,"RangedDistance",5);
  eoserv_config_default<bool>(config,"ItemDespawn",false);
  eoserv_config_default<int>(config,"ItemDespawnCheck",0x3c);
  eoserv_config_default<int>(config,"ItemDespawnRate",600);
  eoserv_config_default<int>(config,"RecoverSpeed",0x5a);
  eoserv_config_default<int>(config,"NPCRecoverSpeed",0x69);
  eoserv_config_default<double>(config,"HPRecoverRate",0.1);
  eoserv_config_default<double>(config,"SitHPRecoverRate",0.2);
  eoserv_config_default<double>(config,"TPRecoverRate",0.1);
  eoserv_config_default<double>(config,"SitTPRecoverRate",0.2);
  eoserv_config_default<double>(config,"NPCRecoverRate",0.1);
  eoserv_config_default<double>(config,"SpikeTime",1.5);
  eoserv_config_default<double>(config,"SpikeDamage",0.2);
  eoserv_config_default<int>(config,"DrainTime",0xf);
  eoserv_config_default<double>(config,"DrainHPDamage",0.2);
  eoserv_config_default<double>(config,"DrainTPDamage",0.1);
  eoserv_config_default<int>(config,"QuakeRate",5);
  eoserv_config_default<char_const*>(config,"Quake1","4,12,0,1");
  eoserv_config_default<char_const*>(config,"Quake2","6,12,0,2");
  eoserv_config_default<char_const*>(config,"Quake3","2,10,3,5");
  eoserv_config_default<char_const*>(config,"Quake4","1,4,6,8");
  eoserv_config_default<int>(config,"ChatLength",0x80);
  eoserv_config_default<int>(config,"ShareMode",2);
  eoserv_config_default<int>(config,"PartyShareMode",2);
  eoserv_config_default<int>(config,"DropRateMode",3);
  eoserv_config_default<bool>(config,"GhostNPC",false);
  eoserv_config_default<bool>(config,"GhostArena",false);
  eoserv_config_default<bool>(config,"AllowStats",true);
  eoserv_config_default<int>(config,"StartMap",0);
  eoserv_config_default<int>(config,"StartX",0);
  eoserv_config_default<int>(config,"StartY",0);
  eoserv_config_default<int>(config,"JailMap",0x4c);
  eoserv_config_default<int>(config,"JailX",6);
  eoserv_config_default<int>(config,"JailY",7);
  eoserv_config_default<int>(config,"UnJailX",8);
  eoserv_config_default<int>(config,"UnJailY",0xb);
  eoserv_config_default<char_const*>(config,"StartItems","");
  eoserv_config_default<char_const*>(config,"StartSpells","");
  eoserv_config_default<char_const*>(config,"StartEquipMale","0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,");
  eoserv_config_default<char_const*>(config,"StartEquipFemale","0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,");
  eoserv_config_default<int>(config,"MaxHairStyle",0x14);
  eoserv_config_default<int>(config,"MaxHairColor",9);
  eoserv_config_default<int>(config,"MaxSkin",6);
  eoserv_config_default<int>(config,"CreateMinHairStyle",1);
  eoserv_config_default<int>(config,"CreateMaxHairStyle",0x14);
  eoserv_config_default<int>(config,"CreateMinHairColor",0);
  eoserv_config_default<int>(config,"CreateMaxHairColor",9);
  eoserv_config_default<int>(config,"CreateMinSkin",0);
  eoserv_config_default<int>(config,"CreateMaxSkin",3);
  eoserv_config_default<char_const*>(config,"DefaultBanLength","2h");
  eoserv_config_default<bool>(config,"LimitDamage",true);
  eoserv_config_default<double>(config,"DeathRecover",0.5);
  eoserv_config_default<bool>(config,"Deadly",false);
  eoserv_config_default<double>(config,"ExpRate",1.0);
  eoserv_config_default<double>(config,"DropRate",1.0);
  eoserv_config_default<double>(config,"MobRate",1.0);
  eoserv_config_default<double>(config,"PKRate",0.75);
  eoserv_config_default<double>(config,"CriticalRate",0.0);
  eoserv_config_default<bool>(config,"CriticalFirstHit",false);
  eoserv_config_default<double>(config,"SpawnRate",1.0);
  eoserv_config_default<int>(config,"BarberBase",0);
  eoserv_config_default<int>(config,"BarberStep",200);
  eoserv_config_default<int>(config,"BankUpgradeBase",1000);
  eoserv_config_default<int>(config,"BankUpgradeStep",1000);
  eoserv_config_default<int>(config,"JukeboxSongs",0x14);
  eoserv_config_default<int>(config,"JukeboxPrice",0x19);
  eoserv_config_default<int>(config,"JukeboxTimer",0x5a);
  eoserv_config_default<bool>(config,"RespawnBossChildren",true);
  eoserv_config_default<bool>(config,"OldReports",false);
  eoserv_config_default<int>(config,"WarpSuck",0xf);
  eoserv_config_default<int>(config,"EvacuateSound",0x33);
  eoserv_config_default<double>(config,"EvacuateLength",30.0);
  eoserv_config_default<double>(config,"EvacuateStep",10.0);
  eoserv_config_default<double>(config,"EvacuateTick",2.0);
  eoserv_config_default<bool>(config,"UseAdjustedStats",true);
  eoserv_config_default<int>(config,"BaseMinDamage",0);
  eoserv_config_default<int>(config,"BaseMaxDamage",1);
  eoserv_config_default<bool>(config,"BaseDamageAtZero",true);
  eoserv_config_default<bool>(config,"SilentMute",true);
  eoserv_config_default<bool>(config,"CitizenSubscribeAnytime",false);
  eoserv_config_default<bool>(config,"CitizenUnsubscribeAnywhere",false);
  eoserv_config_default<int>(config,"ClockMaxDelta",1000);
  eoserv_config_default<bool>(config,"TradeAddQuantity",false);
  eoserv_config_default<bool>(config,"LogReports",false);
  eoserv_config_default<int>(config,"ReportChatLogSize",0x19);
  eoserv_config_default<bool>(config,"UseDutyAdmin",false);
  eoserv_config_default<int>(config,"NoInteractDefault",0);
  eoserv_config_default<int>(config,"NoInteractDefaultAdmin",2);
  eoserv_config_default<char_const*>(config,"NPCMovementRate","0.9, 0.6, 1.3, 1.9, 3.7, 7.5, 15.0");
  eoserv_config_default<char_const*>(config,"SpawnNPCSpeed","0");
  eoserv_config_default<double>(config,"DoorTimer",3.0);
  eoserv_config_default<int>(config,"ChatMaxWidth",0x578);
  eoserv_config_default<int>(config,"AccountMinLength",4);
  eoserv_config_default<int>(config,"AccountMaxLength",0x10);
  eoserv_config_default<int>(config,"PasswordMinLength",6);
  eoserv_config_default<int>(config,"PasswordMaxLength",0xc);
  eoserv_config_default<int>(config,"RealNameMaxLength",0x40);
  eoserv_config_default<int>(config,"LocationMaxLength",0x40);
  eoserv_config_default<int>(config,"EmailMaxLength",0x40);
  eoserv_config_default<int>(config,"ComputerNameLength",0x40);
  eoserv_config_default<int>(config,"LimitAttack",0xfb);
  eoserv_config_default<int>(config,"MuteLength",0x5a);
  eoserv_config_default<char_const*>(config,"InstrumentItems","49, 50");
  eoserv_config_default<int>(config,"MaxBankGold",2000000000);
  eoserv_config_default<int>(config,"MaxItem",2000000000);
  eoserv_config_default<int>(config,"MaxDrop",10000000);
  eoserv_config_default<int>(config,"MaxChest",10000000);
  eoserv_config_default<int>(config,"ChestSlots",5);
  eoserv_config_default<int>(config,"MaxBank",200);
  eoserv_config_default<int>(config,"BaseBankSize",0x19);
  eoserv_config_default<int>(config,"BankSizeStep",5);
  eoserv_config_default<int>(config,"MaxBankUpgrades",7);
  eoserv_config_default<double>(config,"PacketRateFace",0.09);
  eoserv_config_default<double>(config,"PacketRateWalk",0.46);
  eoserv_config_default<double>(config,"PacketRateAttack",0.58);
  eoserv_config_default<int>(config,"MaxTile",8);
  eoserv_config_default<int>(config,"MaxMap",400);
  eoserv_config_default<int>(config,"MaxTrade",2000000000);
  return;
}

Assistant:

void eoserv_config_validate_config(Config& config)
{
	eoserv_config_default(config, "LogOut"             , "-");
	eoserv_config_default(config, "LogErr"             , "error.log");
	eoserv_config_default(config, "StyleConsole"       , true);
	eoserv_config_default(config, "LogCommands"        , true);
	eoserv_config_default(config, "Host"               , "0.0.0.0");
	eoserv_config_default(config, "Port"               , 8078);
	eoserv_config_default(config, "MaxConnections"     , 300);
	eoserv_config_default(config, "ListenBacklog"      , 50);
	eoserv_config_default(config, "MaxPlayers"         , 200);
	eoserv_config_default(config, "MaxConnectionsPerIP", 3);
	eoserv_config_default(config, "IPReconnectLimit"   , 10.0);
	eoserv_config_default(config, "MaxConnectionsPerPC", 1);
	eoserv_config_default(config, "HangupDelay"        , 10.0);
	eoserv_config_default(config, "QuietConnectionErrors", false);
	eoserv_config_default(config, "MaxLoginAttempts"   , 3);
	eoserv_config_default(config, "CheckVersion"       , true);
	eoserv_config_default(config, "MinVersion"         , 0);
	eoserv_config_default(config, "MaxVersion"         , 0);
	eoserv_config_default(config, "OldVersionCompat"   , false);
	eoserv_config_default(config, "TimedSave"          , "5m");
	eoserv_config_default(config, "IgnoreHDID"         , false);
	eoserv_config_default(config, "ServerLanguage"     , "./lang/en.ini");
	eoserv_config_default(config, "PacketQueueMax"     , 40);
	eoserv_config_default(config, "PingRate"           , 60.0);
	eoserv_config_default(config, "EnforceSequence"    , true);
	eoserv_config_default(config, "EnforceTimestamps"  , true);
	eoserv_config_default(config, "EnforceSessions"    , true);
	eoserv_config_default(config, "PasswordSalt"       , "ChangeMe");
	eoserv_config_default(config, "SeoseCompat"        , "ChangeMe");
	eoserv_config_default(config, "SeoseCompatKey"     , "D4q9_f30da%#q02#)8");
	eoserv_config_default(config, "DBType"             , "mysql");
	eoserv_config_default(config, "DBHost"             , "localhost");
	eoserv_config_default(config, "DBUser"             , "eoserv");
	eoserv_config_default(config, "DBPass"             , "eoserv");
	eoserv_config_default(config, "DBName"             , "eoserv");
	eoserv_config_default(config, "DBPort"             , 0);
	eoserv_config_default(config, "EIF"                , "./data/pub/dat001.eif");
	eoserv_config_default(config, "ENF"                , "./data/pub/dtn001.enf");
	eoserv_config_default(config, "ESF"                , "./data/pub/dsl001.esf");
	eoserv_config_default(config, "ECF"                , "./data/pub/dat001.ecf");
	eoserv_config_default(config, "AutoSplitPubFiles"  , true);
	eoserv_config_default(config, "NewsFile"           , "./data/news.txt");
	eoserv_config_default(config, "DropsFile"          , "./data/drops.ini");
	eoserv_config_default(config, "ShopsFile"          , "./data/shops.ini");
	eoserv_config_default(config, "ArenasFile"         , "./data/arenas.ini");
	eoserv_config_default(config, "FormulasFile"       , "./data/formulas.ini");
	eoserv_config_default(config, "HomeFile"           , "./data/home.ini");
	eoserv_config_default(config, "SkillsFile"         , "./data/skills.ini");
	eoserv_config_default(config, "MapDir"             , "./data/maps/");
	eoserv_config_default(config, "Maps"               , 278);
	eoserv_config_default(config, "QuestDir"           , "./data/quests/");
	eoserv_config_default(config, "Quests"             , 0);
	eoserv_config_default(config, "BotCharacters"      , "");
	eoserv_config_default(config, "GuildPrice"         , 50000);
	eoserv_config_default(config, "RecruitCost"        , 1000);
	eoserv_config_default(config, "GuildMaxMembers"    , 5000);
	eoserv_config_default(config, "GuildCreateMembers" , 9);
	eoserv_config_default(config, "GuildBankMax"       , 2000000000);
	eoserv_config_default(config, "GuildDefaultRanks"  , "Leader,Recruiter,,,,,,,New Member");
	eoserv_config_default(config, "GuildShowRecruiters", true);
	eoserv_config_default(config, "GuildCustomRanks"   , false);
	eoserv_config_default(config, "GuildEditRank"      , 1);
	eoserv_config_default(config, "GuildKickRank"      , 1);
	eoserv_config_default(config, "GuildPromoteRank"   , 1);
	eoserv_config_default(config, "GuildPromoteSameRank", 1);
	eoserv_config_default(config, "GuildDemoteRank"    , 1);
	eoserv_config_default(config, "GuildRecruitRank"   , 2);
	eoserv_config_default(config, "GuildDisbandRank"   , 0);
	eoserv_config_default(config, "GuildMultipleFounders", true);
	eoserv_config_default(config, "GuildAnnounce"      , true);
	eoserv_config_default(config, "GuildDateFormat"    , "%Y/%m/%d");
	eoserv_config_default(config, "GuildMinDeposit"    , 1000);
	eoserv_config_default(config, "GuildMaxNameLength" , 24);
	eoserv_config_default(config, "GuildMaxDescLength" , 240);
	eoserv_config_default(config, "GuildMaxRankLength" , 16);
	eoserv_config_default(config, "GuildMaxWidth"      , 180);
	eoserv_config_default(config, "GlobalPK"           , false);
	eoserv_config_default(config, "PKExcept"           , "");
	eoserv_config_default(config, "NPCChaseMode"       , 0);
	eoserv_config_default(config, "NPCChaseDistance"   , 18);
	eoserv_config_default(config, "NPCBoredTimer"      , 30);
	eoserv_config_default(config, "NPCAdjustMaxDam"    , 3);
	eoserv_config_default(config, "BoardMaxPosts"      , 20);
	eoserv_config_default(config, "BoardMaxUserPosts"  , 6);
	eoserv_config_default(config, "BoardMaxRecentPosts", 2);
	eoserv_config_default(config, "BoardRecentPostTime", 1800);
	eoserv_config_default(config, "BoardMaxSubjectLength", 32);
	eoserv_config_default(config, "BoardMaxPostLength" , 2048);
	eoserv_config_default(config, "BoardDatePosts"     , true);
	eoserv_config_default(config, "AdminBoard"         , 8);
	eoserv_config_default(config, "AdminBoardLimit"    , 100);
	eoserv_config_default(config, "FirstCharacterAdmin", true);
	eoserv_config_default(config, "ShowLevel"          , false);
	eoserv_config_default(config, "WarpBubbles"        , true);
	eoserv_config_default(config, "HideGlobal"         , false);
	eoserv_config_default(config, "GlobalBuffer"       , 0);
	eoserv_config_default(config, "AdminPrefix"        , "$");
	eoserv_config_default(config, "StatPerLevel"       , 3);
	eoserv_config_default(config, "SkillPerLevel"      , 4);
	eoserv_config_default(config, "EnforceWeight"      , 2);
	eoserv_config_default(config, "MaxWeight"          , 250);
	eoserv_config_default(config, "MaxLevel"           , 250);
	eoserv_config_default(config, "MaxExp"             , 2000000000);
	eoserv_config_default(config, "MaxStat"            , 10000);
	eoserv_config_default(config, "MaxHPTP"            , 64000);
	eoserv_config_default(config, "MaxSkillLevel"      , 100);
	eoserv_config_default(config, "MaxSkills"          , 48);
	eoserv_config_default(config, "MaxCharacters"      , 3);
	eoserv_config_default(config, "MaxShopBuy"         , 4);
	eoserv_config_default(config, "GhostTimer"         , 4);
	eoserv_config_default(config, "SpellCastCooldown"  , 0.6);
	eoserv_config_default(config, "DropTimer"          , 120);
	eoserv_config_default(config, "DropAmount"         , 15);
	eoserv_config_default(config, "ProtectPlayerDrop"  , 5);
	eoserv_config_default(config, "ProtectNPCDrop"     , 30);
	eoserv_config_default(config, "ProtectPKDrop"      , 60);
	eoserv_config_default(config, "ProtectDeathDrop"   , 300);
	eoserv_config_default(config, "SeeDistance"        , 11);
	eoserv_config_default(config, "DropDistance"       , 2);
	eoserv_config_default(config, "RangedDistance"     , 5);
	eoserv_config_default(config, "ItemDespawn"        , false);
	eoserv_config_default(config, "ItemDespawnCheck"   , 60);
	eoserv_config_default(config, "ItemDespawnRate"    , 600);
	eoserv_config_default(config, "RecoverSpeed"       , 90);
	eoserv_config_default(config, "NPCRecoverSpeed"    , 105);
	eoserv_config_default(config, "HPRecoverRate"      , 0.1);
	eoserv_config_default(config, "SitHPRecoverRate"   , 0.2);
	eoserv_config_default(config, "TPRecoverRate"      , 0.1);
	eoserv_config_default(config, "SitTPRecoverRate"   , 0.2);
	eoserv_config_default(config, "NPCRecoverRate"     , 0.1);
	eoserv_config_default(config, "SpikeTime"          , 1.5);
	eoserv_config_default(config, "SpikeDamage"        , 0.2);
	eoserv_config_default(config, "DrainTime"          , 15);
	eoserv_config_default(config, "DrainHPDamage"      , 0.2);
	eoserv_config_default(config, "DrainTPDamage"      , 0.1);
	eoserv_config_default(config, "QuakeRate"          , 5);
	eoserv_config_default(config, "Quake1"             , "4,12,0,1");
	eoserv_config_default(config, "Quake2"             , "6,12,0,2");
	eoserv_config_default(config, "Quake3"             , "2,10,3,5");
	eoserv_config_default(config, "Quake4"             , "1,4,6,8");
	eoserv_config_default(config, "ChatLength"         , 128);
	eoserv_config_default(config, "ShareMode"          , 2);
	eoserv_config_default(config, "PartyShareMode"     , 2);
	eoserv_config_default(config, "DropRateMode"       , 3);
	eoserv_config_default(config, "GhostNPC"           , false);
	eoserv_config_default(config, "GhostArena"         , false);
	eoserv_config_default(config, "AllowStats"         , true);
	eoserv_config_default(config, "StartMap"           , 0);
	eoserv_config_default(config, "StartX"             , 0);
	eoserv_config_default(config, "StartY"             , 0);
	eoserv_config_default(config, "JailMap"            , 76);
	eoserv_config_default(config, "JailX"              , 6);
	eoserv_config_default(config, "JailY"              , 7);
	eoserv_config_default(config, "UnJailX"            , 8);
	eoserv_config_default(config, "UnJailY"            , 11);
	eoserv_config_default(config, "StartItems"         , "");
	eoserv_config_default(config, "StartSpells"        , "");
	eoserv_config_default(config, "StartEquipMale"     , "0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,");
	eoserv_config_default(config, "StartEquipFemale"   , "0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,");
	eoserv_config_default(config, "MaxHairStyle"       , 20);
	eoserv_config_default(config, "MaxHairColor"       , 9);
	eoserv_config_default(config, "MaxSkin"            , 6);
	eoserv_config_default(config, "CreateMinHairStyle" , 1);
	eoserv_config_default(config, "CreateMaxHairStyle" , 20);
	eoserv_config_default(config, "CreateMinHairColor" , 0);
	eoserv_config_default(config, "CreateMaxHairColor" , 9);
	eoserv_config_default(config, "CreateMinSkin"      , 0);
	eoserv_config_default(config, "CreateMaxSkin"      , 3);
	eoserv_config_default(config, "DefaultBanLength"   , "2h");
	eoserv_config_default(config, "LimitDamage"        , true);
	eoserv_config_default(config, "DeathRecover"       , 0.5);
	eoserv_config_default(config, "Deadly"             , false);
	eoserv_config_default(config, "ExpRate"            , 1.0);
	eoserv_config_default(config, "DropRate"           , 1.0);
	eoserv_config_default(config, "MobRate"            , 1.0);
	eoserv_config_default(config, "PKRate"             , 0.75);
	eoserv_config_default(config, "CriticalRate"       , 0.00);
	eoserv_config_default(config, "CriticalFirstHit"   , false);
	eoserv_config_default(config, "SpawnRate"          , 1.0);
	eoserv_config_default(config, "BarberBase"         , 0);
	eoserv_config_default(config, "BarberStep"         , 200);
	eoserv_config_default(config, "BankUpgradeBase"    , 1000);
	eoserv_config_default(config, "BankUpgradeStep"    , 1000);
	eoserv_config_default(config, "JukeboxSongs"       , 20);
	eoserv_config_default(config, "JukeboxPrice"       , 25);
	eoserv_config_default(config, "JukeboxTimer"       , 90);
	eoserv_config_default(config, "RespawnBossChildren", true);
	eoserv_config_default(config, "OldReports"         , false);
	eoserv_config_default(config, "WarpSuck"           , 15);
	eoserv_config_default(config, "EvacuateSound"      , 51);
	eoserv_config_default(config, "EvacuateLength"     , 30.0);
	eoserv_config_default(config, "EvacuateStep"       , 10.0);
	eoserv_config_default(config, "EvacuateTick"       , 2.0);
	eoserv_config_default(config, "UseAdjustedStats"   , true);
	eoserv_config_default(config, "BaseMinDamage"      , 0);
	eoserv_config_default(config, "BaseMaxDamage"      , 1);
	eoserv_config_default(config, "BaseDamageAtZero"   , true);
	eoserv_config_default(config, "SilentMute"         , true);
	eoserv_config_default(config, "CitizenSubscribeAnytime", false);
	eoserv_config_default(config, "CitizenUnsubscribeAnywhere", false);
	eoserv_config_default(config, "ClockMaxDelta"      , 1000);
	eoserv_config_default(config, "TradeAddQuantity"   , false);
	eoserv_config_default(config, "LogReports"         , false);
	eoserv_config_default(config, "ReportChatLogSize"  , 25);
	eoserv_config_default(config, "UseDutyAdmin"       , false);
	eoserv_config_default(config, "NoInteractDefault"  , 0);
	eoserv_config_default(config, "NoInteractDefaultAdmin", 2);
	eoserv_config_default(config, "NPCMovementRate"    , "0.9, 0.6, 1.3, 1.9, 3.7, 7.5, 15.0");
	eoserv_config_default(config, "SpawnNPCSpeed"      , "0");
	eoserv_config_default(config, "DoorTimer"          , 3.0);
	eoserv_config_default(config, "ChatMaxWidth"       , 1400);
	eoserv_config_default(config, "AccountMinLength"   , 4);
	eoserv_config_default(config, "AccountMaxLength"   , 16);
	eoserv_config_default(config, "PasswordMinLength"  , 6);
	eoserv_config_default(config, "PasswordMaxLength"  , 12);
	eoserv_config_default(config, "RealNameMaxLength"  , 64);
	eoserv_config_default(config, "LocationMaxLength"  , 64);
	eoserv_config_default(config, "EmailMaxLength"     , 64);
	eoserv_config_default(config, "ComputerNameLength" , 64);
	eoserv_config_default(config, "LimitAttack"        , 251);
	eoserv_config_default(config, "MuteLength"         , 90);
	eoserv_config_default(config, "InstrumentItems"    , "49, 50");
	eoserv_config_default(config, "MaxBankGold"        , 2000000000);
	eoserv_config_default(config, "MaxItem"            , 2000000000);
	eoserv_config_default(config, "MaxDrop"            , 10000000);
	eoserv_config_default(config, "MaxChest"           , 10000000);
	eoserv_config_default(config, "ChestSlots"         , 5);
	eoserv_config_default(config, "MaxBank"            , 200);
	eoserv_config_default(config, "BaseBankSize"       , 25);
	eoserv_config_default(config, "BankSizeStep"       , 5);
	eoserv_config_default(config, "MaxBankUpgrades"    , 7);
	eoserv_config_default(config, "PacketRateFace"     , 0.09);
	eoserv_config_default(config, "PacketRateWalk"     , 0.46);
	eoserv_config_default(config, "PacketRateAttack"   , 0.58);
	eoserv_config_default(config, "MaxTile"            , 8);
	eoserv_config_default(config, "MaxMap"             , 400);
	eoserv_config_default(config, "MaxTrade"           , 2000000000);
}